

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCountTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::TextureCountTests::init(TextureCountTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 internalFormat;
  int numTextures;
  Context *context;
  long *plVar1;
  undefined8 *puVar2;
  char *__s;
  Texture2DRenderCase *this_00;
  long lVar3;
  size_type *psVar4;
  undefined8 uVar5;
  ulong uVar6;
  ostringstream *poVar7;
  int row;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  allocator<char> local_249;
  string description;
  string name;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  TestNode *local_1e0;
  long local_1d8;
  char *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  ios_base local_138 [264];
  
  local_1d8 = 0;
  local_1e0 = (TestNode *)this;
  do {
    internalFormat = init::texFormats[local_1d8].internalFormat;
    local_1d0 = init::texFormats[local_1d8].name;
    lVar10 = 0;
    do {
      numTextures = deqp::gles2::Performance::
                    addShaderCompilationPerformanceCases(deqp::gles2::TestCaseGroup&)::
                    texLookupCounts[lVar10];
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,local_1d0,&local_249);
      plVar1 = (long *)std::__cxx11::string::append((char *)local_1c8);
      description._M_dataplus._M_p = (pointer)&description.field_2;
      psVar4 = (size_type *)(plVar1 + 2);
      if ((size_type *)*plVar1 == psVar4) {
        description.field_2._M_allocated_capacity = *psVar4;
        description.field_2._8_8_ = plVar1[3];
      }
      else {
        description.field_2._M_allocated_capacity = *psVar4;
        description._M_dataplus._M_p = (pointer)*plVar1;
      }
      description._M_string_length = plVar1[1];
      *plVar1 = (long)psVar4;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,numTextures);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar5 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        uVar5 = description.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < local_1f8 + description._M_string_length) {
        uVar6 = 0xf;
        if (local_200 != local_1f0) {
          uVar6 = local_1f0[0];
        }
        if (uVar6 < local_1f8 + description._M_string_length) goto LAB_012f4696;
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_200,0,(char *)0x0,(ulong)description._M_dataplus._M_p);
      }
      else {
LAB_012f4696:
        puVar2 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&description,(ulong)local_200);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar4 = puVar2 + 2;
      if ((size_type *)*puVar2 == psVar4) {
        name.field_2._M_allocated_capacity = *psVar4;
        name.field_2._8_8_ = puVar2[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar4;
        name._M_dataplus._M_p = (pointer)*puVar2;
      }
      name._M_string_length = puVar2[1];
      *puVar2 = psVar4;
      puVar2[1] = 0;
      *(char *)psVar4 = '\0';
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      __s = glu::getTextureFormatName(internalFormat);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&description,__s,(allocator<char> *)&local_1a8);
      this_00 = (Texture2DRenderCase *)operator_new(0x218);
      context = (Context *)local_1e0[1]._vptr_TestNode;
      local_198 = 0;
      uStack_190 = 0;
      local_1a8 = 0;
      uStack_1a0 = 0;
      local_188 = 0;
      lVar3 = 0;
      lVar8 = 0;
      poVar7 = (ostringstream *)&local_1a8;
      do {
        lVar9 = 0;
        do {
          uVar11 = 0x3f800000;
          if (lVar3 != lVar9) {
            uVar11 = 0;
          }
          *(undefined4 *)(poVar7 + lVar9) = uVar11;
          lVar9 = lVar9 + 0xc;
        } while (lVar9 != 0x24);
        lVar8 = lVar8 + 1;
        poVar7 = poVar7 + 4;
        lVar3 = lVar3 + 0xc;
      } while (lVar8 != 3);
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,name._M_dataplus._M_p,description._M_dataplus._M_p,internalFormat,
                 0x812f,0x812f,0x2600,0x2600,(Mat3 *)&local_1a8,numTextures,false);
      tcu::TestNode::addChild(local_1e0,(TestNode *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_1d8 = local_1d8 + 1;
    if (local_1d8 == 7) {
      return 7;
    }
  } while( true );
}

Assistant:

void TextureCountTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB565	},
		{ "rgb8",		GL_RGB8		},
		{ "rgba8",		GL_RGBA8	},
		{ "rgba8ui",	GL_RGBA8UI	},
		{ "rg16f",		GL_RG16F	},
		{ "rgba16f",	GL_RGBA16F	},
		{ "rgba32f",	GL_RGBA32F	}
	};
	static const int texCounts[] = { 1, 2, 4, 8 };

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		for (int cntNdx = 0; cntNdx < DE_LENGTH_OF_ARRAY(texCounts); cntNdx++)
		{
			deUint32	format			= texFormats[formatNdx].internalFormat;
			deUint32	wrapS			= GL_CLAMP_TO_EDGE;
			deUint32	wrapT			= GL_CLAMP_TO_EDGE;
			deUint32	minFilter		= GL_NEAREST;
			deUint32	magFilter		= GL_NEAREST;
			int			numTextures		= texCounts[cntNdx];
			string		name			= string(texFormats[formatNdx].name) + "_" + de::toString(numTextures);
			string		description		= glu::getTextureFormatName(format);

			addChild(new Texture2DRenderCase(m_context, name.c_str(), description.c_str(), format, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
		}
	}
}